

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void HandleDeprecatedFlags(AActor *defaults,PClassActor *info,bool set,int index)

{
  PClassActor *pPVar1;
  ENamedName EVar2;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  undefined1 local_30 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_2e;
  undefined1 local_2c [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_2a;
  undefined1 local_28 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_26;
  FName local_24;
  int local_20;
  byte local_19;
  int index_local;
  bool set_local;
  PClassActor *info_local;
  AActor *defaults_local;
  
  local_20 = index;
  local_19 = set;
  _index_local = info;
  info_local = (PClassActor *)defaults;
  switch(index) {
  case 1:
    EVar2 = NAME_None;
    if (set) {
      EVar2 = NAME_Fire;
    }
    FNameNoInit::operator=(&defaults->DamageType,EVar2);
    break;
  case 2:
    EVar2 = NAME_None;
    if (set) {
      EVar2 = NAME_Ice;
    }
    FNameNoInit::operator=(&defaults->DamageType,EVar2);
    break;
  case 3:
    local_40 = 0.125;
    if (!set) {
      local_40 = 1.0;
    }
    defaults->Gravity = local_40;
    break;
  case 4:
    local_60 = 196.0;
    if (!set) {
      local_60 = 0.0;
    }
    defaults->meleethreshold = local_60;
    break;
  case 5:
    local_50 = 896.0;
    if (!set) {
      local_50 = 0.0;
    }
    defaults->maxtargetrange = local_50;
    break;
  case 6:
    if (set) {
      pPVar1 = FindClassTentative("PickupFlash",AActor::RegistrationInfo.MyClass);
      *(PClassActor **)&info_local[2].BloodColor = pPVar1;
    }
    else {
      defaults[1].super_DThinker.PrevThinker = (DThinker *)0x0;
    }
    break;
  case 7:
    local_70 = 0.25;
    if (!set) {
      local_70 = 1.0;
    }
    defaults->Gravity = local_70;
    break;
  case 8:
    FName::FName(&local_24,NAME_Fire);
    local_80 = 0.5;
    if ((local_19 & 1) == 0) {
      local_80 = 1.0;
    }
    PClassActor::SetDamageFactor(info,&local_24,local_80);
    break;
  case 9:
    operator|((EnumType)local_28,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator~(&local_26);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&=
              ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,&local_26);
    if ((local_19 & 1) != 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator|=
                ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,
                 BOUNCE_HereticCompat);
    }
    break;
  case 10:
    operator|((EnumType)local_2c,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator~(&local_2a);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&=
              ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,&local_2a);
    if ((local_19 & 1) != 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator|=
                ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,
                 BOUNCE_HexenCompat);
    }
    break;
  case 0xb:
    operator|((EnumType)local_30,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator~(&local_2e);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&=
              ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,&local_2e);
    if ((local_19 & 1) != 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator|=
                ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].Replacement,
                 BOUNCE_DoomCompat);
    }
    break;
  case 0xc:
    *(uint *)&defaults[1].super_DThinker.super_DObject.ObjNext = (uint)!set;
  }
  return;
}

Assistant:

void HandleDeprecatedFlags(AActor *defaults, PClassActor *info, bool set, int index)
{
	switch (index)
	{
	case DEPF_FIREDAMAGE:
		defaults->DamageType = set? NAME_Fire : NAME_None;
		break;
	case DEPF_ICEDAMAGE:
		defaults->DamageType = set? NAME_Ice : NAME_None;
		break;
	case DEPF_LOWGRAVITY:
		defaults->Gravity = set ? 1. / 8 : 1.;
		break;
	case DEPF_SHORTMISSILERANGE:
		defaults->maxtargetrange = set? 896. : 0.;
		break;
	case DEPF_LONGMELEERANGE:
		defaults->meleethreshold = set? 196. : 0.;
		break;
	case DEPF_QUARTERGRAVITY:
		defaults->Gravity = set ? 1. / 4 : 1.;
		break;
	case DEPF_FIRERESIST:
		info->SetDamageFactor(NAME_Fire, set ? 0.5 : 1.);
		break;
	// the bounce flags will set the compatibility bounce modes to remain compatible
	case DEPF_HERETICBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_HereticCompat;
		break;
	case DEPF_HEXENBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_HexenCompat;
		break;
	case DEPF_DOOMBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_DoomCompat;
		break;
	case DEPF_PICKUPFLASH:
		if (set)
		{
			static_cast<AInventory*>(defaults)->PickupFlash = FindClassTentative("PickupFlash", RUNTIME_CLASS(AActor));
		}
		else
		{
			static_cast<AInventory*>(defaults)->PickupFlash = NULL;
		}
		break;
	case DEPF_INTERHUBSTRIP: // Old system was 0 or 1, so if the flag is cleared, assume 1.
		static_cast<AInventory*>(defaults)->InterHubAmount = set ? 0 : 1;
	default:
		break;	// silence GCC
	}
}